

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,4>,float,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,4>,tcu::Vector<float,4>>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>_>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  _Rb_tree_node_base *p_Var1;
  float fVar2;
  pointer pVVar3;
  pointer pVVar4;
  Variable<tcu::Vector<float,_4>_> *pVVar5;
  pointer pcVar6;
  Variable<float> *pVVar7;
  qpTestLog *pqVar8;
  PrecisionCase *pPVar9;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>_>_>
  *pVVar10;
  undefined8 uVar11;
  bool bVar12;
  bool bVar13;
  ContextType type;
  int iVar14;
  uint uVar15;
  _Rb_tree_node_base *p_Var16;
  char *__s;
  size_t sVar17;
  long *plVar18;
  ShaderExecutor *pSVar19;
  long lVar20;
  IVal *pIVar21;
  IVal *pIVar22;
  TestError *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  Vector<float,_4> *val;
  size_t sVar24;
  FloatFormat *fmt;
  MessageBuilder *pMVar25;
  ulong uVar26;
  byte bVar27;
  IVal in2;
  IVal in3;
  ostringstream os;
  FloatFormat highpFmt;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>_>_>
  outputs;
  Environment env;
  ShaderSpec spec;
  FuncSet funcs;
  ostringstream oss;
  undefined1 auStack_578 [8];
  PrecisionCase *local_570;
  string local_568;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_548;
  Statement *local_540;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>_>_>
  *local_538;
  undefined1 local_530 [16];
  undefined1 auStack_520 [80];
  string local_4d0;
  size_t local_4b0;
  ulong local_4a8;
  ResultCollector *local_4a0;
  undefined1 local_498 [8];
  qpTestLog *pqStack_490;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488;
  double local_478;
  Data local_470;
  undefined4 local_460;
  ios_base local_428 [8];
  ios_base local_420 [264];
  FloatFormat local_318;
  ulong local_2e8;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>_>_>
  local_2e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_2b0;
  undefined1 local_280 [56];
  _Alloc_hider local_248;
  size_type local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  _Alloc_hider local_228;
  size_type local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  undefined1 local_208 [16];
  _Base_ptr local_1f8;
  _Rb_tree_node_base *local_1f0;
  _Rb_tree_node_base *local_1e8;
  double local_1e0;
  undefined1 auStack_1b0 [8];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  bVar27 = 0;
  pVVar3 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar4 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  sVar24 = (long)pVVar4 - (long)pVVar3 >> 4;
  local_548 = inputs;
  local_540 = stmt;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>_>_>
  ::Outputs(&local_2e0,sVar24);
  local_248._M_p = (pointer)&local_238;
  local_280._0_4_ = GLSL_VERSION_300_ES;
  local_280._8_8_ = (pointer)0x0;
  local_280._16_8_ = (pointer)0x0;
  local_280._24_8_ = (pointer)0x0;
  local_280._32_8_ = (pointer)0x0;
  local_280._40_8_ = (pointer)0x0;
  local_280._48_8_ = (pointer)0x0;
  local_240 = 0;
  local_238._M_local_buf[0] = '\0';
  local_228._M_p = (pointer)&local_218;
  local_220 = 0;
  local_218._M_local_buf[0] = '\0';
  local_318.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_318.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_318.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_318.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_318.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_318.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_318.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_318.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_318._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_2b0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2b0._M_impl.super__Rb_tree_header._M_header;
  local_2b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2b0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_498 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_570 = this;
  local_2b0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2b0._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pqStack_490);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_490,"Statement: ",0xb);
  (*local_540->_vptr_Statement[2])(local_540,(ostringstream *)&pqStack_490);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_4b0 = sVar24;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pqStack_490);
  std::ios_base::~ios_base(local_420);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var1 = (_Rb_tree_node_base *)(local_208 + 8);
  local_208._8_4_ = _S_red;
  local_1f8 = (_Base_ptr)0x0;
  local_1e0 = 0.0;
  local_1f0 = p_Var1;
  local_1e8 = p_Var1;
  (*local_540->_vptr_Statement[4])(local_540,local_208);
  if (local_1f0 != p_Var1) {
    p_Var16 = local_1f0;
    do {
      (**(code **)(**(long **)(p_Var16 + 1) + 0x30))(*(long **)(p_Var16 + 1),local_1a8);
      p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
    } while (p_Var16 != p_Var1);
  }
  if (local_1e0 != 0.0) {
    local_498 = (undefined1  [8])((local_570->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pqStack_490);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pqStack_490,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pqStack_490,(char *)local_530._0_8_,local_530._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((undefined1 *)local_530._0_8_ != auStack_520) {
      operator_delete((void *)local_530._0_8_,auStack_520._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pqStack_490);
    std::ios_base::~ios_base(local_420);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_208);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,"precision ",10);
  __s = glu::getPrecisionName((local_570->m_ctx).precision);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(auStack_578 + *(long *)((long)local_498 + -0x18)) + 0xe0);
  }
  else {
    sVar17 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,__s,sVar17);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_248,(string *)local_1a8);
  pcVar6 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar6) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
  std::ios_base::~ios_base(local_428);
  type.super_ApiType.m_bits =
       (ApiType)(*((local_570->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_280._0_4_ = glu::getContextTypeGLSLVersion(type);
  local_538 = variables;
  if ((local_570->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "#extension ",&local_570->m_extension);
    plVar18 = (long *)std::__cxx11::string::append(local_1a8);
    paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar18 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar18 == paVar23) {
      local_488._M_allocated_capacity = paVar23->_M_allocated_capacity;
      local_488._8_8_ = plVar18[3];
      local_498 = (undefined1  [8])&local_488;
    }
    else {
      local_488._M_allocated_capacity = paVar23->_M_allocated_capacity;
      local_498 = (undefined1  [8])*plVar18;
    }
    pqStack_490 = (qpTestLog *)plVar18[1];
    *plVar18 = (long)paVar23;
    plVar18[1] = 0;
    *(undefined1 *)(plVar18 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_248,(string *)local_498);
    if (local_498 != (undefined1  [8])&local_488) {
      operator_delete((void *)local_498,local_488._M_allocated_capacity + 1);
    }
    variables = local_538;
    if ((pointer)local_1a8._0_8_ != pcVar6) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_280 + 8),2);
  makeSymbol<float>((Symbol *)local_498,local_570,
                    (variables->in1).
                    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr)
  ;
  uVar11 = local_280._8_8_;
  std::__cxx11::string::operator=((string *)(local_280._8_8_ + 0x38),(string *)local_498);
  glu::VarType::operator=(&((pointer)(uVar11 + 0x38))->varType,(VarType *)&local_478);
  glu::VarType::~VarType((VarType *)&local_478);
  if (local_498 != (undefined1  [8])&local_488) {
    operator_delete((void *)local_498,local_488._M_allocated_capacity + 1);
  }
  makeSymbol<tcu::Vector<float,4>>
            ((Symbol *)local_498,local_570,
             (variables->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr);
  uVar11 = local_280._8_8_;
  std::__cxx11::string::operator=((string *)local_280._8_8_,(string *)local_498);
  glu::VarType::operator=((VarType *)(uVar11 + 0x20),(VarType *)&local_478);
  glu::VarType::~VarType((VarType *)&local_478);
  if (local_498 != (undefined1  [8])&local_488) {
    operator_delete((void *)local_498,local_488._M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_280 + 0x20),2);
  makeSymbol<tcu::Vector<float,4>>
            ((Symbol *)local_498,local_570,
             (variables->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr);
  uVar11 = local_280._32_8_;
  std::__cxx11::string::operator=((string *)(local_280._32_8_ + 0x38),(string *)local_498);
  glu::VarType::operator=(&((pointer)(uVar11 + 0x38))->varType,(VarType *)&local_478);
  glu::VarType::~VarType((VarType *)&local_478);
  if (local_498 != (undefined1  [8])&local_488) {
    operator_delete((void *)local_498,local_488._M_allocated_capacity + 1);
  }
  makeSymbol<tcu::Vector<float,4>>
            ((Symbol *)local_498,local_570,
             (variables->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr);
  uVar11 = local_280._32_8_;
  std::__cxx11::string::operator=((string *)local_280._32_8_,(string *)local_498);
  glu::VarType::operator=((VarType *)(uVar11 + 0x20),(VarType *)&local_478);
  glu::VarType::~VarType((VarType *)&local_478);
  if (local_498 != (undefined1  [8])&local_488) {
    operator_delete((void *)local_498,local_488._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
  (*local_540->_vptr_Statement[2])(local_540,local_498);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
  std::ios_base::~ios_base(local_428);
  std::__cxx11::string::operator=((string *)&local_228,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar6) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pPVar9 = local_570;
  pSVar19 = ShaderExecUtil::createExecutor
                      ((local_570->m_ctx).renderContext,(local_570->m_ctx).shaderType,
                       (ShaderSpec *)local_280);
  sVar24 = local_4b0;
  local_498 = (undefined1  [8])
              (local_548->in0).
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  pqStack_490 = (qpTestLog *)
                (local_548->in1).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_488._M_allocated_capacity =
       (size_type)
       (local_548->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_488._8_8_ =
       (local_548->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._0_8_ =
       local_2e0.out0.
       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_2e0.out1.
       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  (*pSVar19->_vptr_ShaderExecutor[3])
            (pSVar19,((pPVar9->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar14 = (*pSVar19->_vptr_ShaderExecutor[2])(pSVar19);
  if ((char)iVar14 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar19->_vptr_ShaderExecutor[5])(pSVar19);
  (*pSVar19->_vptr_ShaderExecutor[6])(pSVar19,sVar24 & 0xffffffff,local_498,local_1a8);
  fmt = &(pPVar9->m_ctx).floatFormat;
  (*pSVar19->_vptr_ShaderExecutor[1])(pSVar19);
  lVar20 = 8;
  do {
    *(undefined1 *)((long)&local_4a0 + lVar20) = 0;
    *(undefined8 *)(local_498 + lVar20) = 0x7ff0000000000000;
    *(undefined8 *)((long)&pqStack_490 + lVar20) = 0xfff0000000000000;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x68);
  lVar20 = 8;
  do {
    *(undefined1 *)((long)&local_4a0 + lVar20) = 0;
    *(undefined8 *)(local_498 + lVar20) = 0x7ff0000000000000;
    *(undefined8 *)((long)&pqStack_490 + lVar20) = 0xfff0000000000000;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x68);
  local_530._0_8_ = local_530._0_8_ & 0xffffffffffffff00;
  local_530._8_8_ = INFINITY;
  auStack_520._0_8_ = -INFINITY;
  lVar20 = 8;
  do {
    auStack_1b0[lVar20] = 0;
    *(undefined8 *)(local_1a8 + lVar20) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar20 + 8) = 0xfff0000000000000;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x68);
  lVar20 = 8;
  do {
    auStack_1b0[lVar20] = 0;
    *(undefined8 *)(local_1a8 + lVar20) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar20 + 8) = 0xfff0000000000000;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x68);
  lVar20 = 8;
  do {
    local_208[lVar20 + -8] = 0;
    *(undefined8 *)(local_208 + lVar20) = 0x7ff0000000000000;
    *(undefined8 *)(local_208 + lVar20 + 8) = 0xfff0000000000000;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x68);
  lVar20 = 8;
  do {
    local_208[lVar20 + -8] = 0;
    *(undefined8 *)(local_208 + lVar20) = 0x7ff0000000000000;
    *(undefined8 *)(local_208 + lVar20 + 8) = 0xfff0000000000000;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x68);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_2b0,
             (variables->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr,(IVal *)local_498);
  Environment::bind<float>
            ((Environment *)&local_2b0,
             (variables->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr,
             (IVal *)local_530);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2b0,
             (variables->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_568);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2b0,
             (variables->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)(auStack_520 + 0x50));
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_2b0,
             (variables->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr,(IVal *)local_1a8);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_2b0,
             (variables->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr,(IVal *)local_208);
  if (pVVar4 == pVVar3) {
LAB_00706a86:
    local_498 = (undefined1  [8])((local_570->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pqStack_490);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_490,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)&pqStack_490);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pqStack_490," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_4a0 = &local_570->m_status;
    local_2e8 = sVar24 + (sVar24 == 0);
    uVar26 = 0;
    local_4a8 = 0;
    do {
      lVar20 = 8;
      do {
        auStack_1b0[lVar20] = 0;
        *(undefined8 *)(local_1a8 + lVar20) = 0x7ff0000000000000;
        *(undefined8 *)(local_1a8 + lVar20 + 8) = 0xfff0000000000000;
        lVar20 = lVar20 + 0x18;
      } while (lVar20 != 0x68);
      lVar20 = 8;
      do {
        auStack_1b0[lVar20] = 0;
        *(undefined8 *)(local_1a8 + lVar20) = 0x7ff0000000000000;
        *(undefined8 *)(local_1a8 + lVar20 + 8) = 0xfff0000000000000;
        lVar20 = lVar20 + 0x18;
      } while (lVar20 != 0x68);
      lVar20 = 8;
      do {
        local_208[lVar20 + -8] = 0;
        *(undefined8 *)(local_208 + lVar20) = 0x7ff0000000000000;
        *(undefined8 *)(local_208 + lVar20 + 8) = 0xfff0000000000000;
        lVar20 = lVar20 + 0x18;
      } while (lVar20 != 0x68);
      lVar20 = 8;
      do {
        local_208[lVar20 + -8] = 0;
        *(undefined8 *)(local_208 + lVar20) = 0x7ff0000000000000;
        *(undefined8 *)(local_208 + lVar20 + 8) = 0xfff0000000000000;
        lVar20 = lVar20 + 0x18;
      } while (lVar20 != 0x68);
      if ((uVar26 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_570->super_TestCase).super_TestNode.m_testCtx);
      }
      pVVar3 = (local_548->in0).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar26;
      local_568._M_dataplus._M_p = *(pointer *)pVVar3->m_data;
      local_568._M_string_length = *(size_type *)(pVVar3->m_data + 2);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doRound
                ((IVal *)local_530,fmt,(Vector<float,_4> *)&local_568);
      pVVar10 = local_538;
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_498,fmt,(IVal *)local_530);
      pIVar21 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_2b0,
                           (pVVar10->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      pMVar25 = (MessageBuilder *)local_498;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *(TestLog **)pIVar21->m_data = pMVar25->m_log;
        pMVar25 = (MessageBuilder *)((long)pMVar25 + (ulong)bVar27 * -0x10 + 8);
        pIVar21 = (IVal *)((long)pIVar21 + ((ulong)bVar27 * -2 + 1) * 8);
      }
      fVar2 = (local_548->in1).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[uVar26];
      pqVar8 = (qpTestLog *)(double)fVar2;
      bVar12 = NAN(fVar2);
      local_498[0] = bVar12;
      pqStack_490 = (qpTestLog *)0x7ff0000000000000;
      if (!bVar12) {
        pqStack_490 = pqVar8;
      }
      local_488._M_allocated_capacity = (size_type)(qpTestLog *)0xfff0000000000000;
      if (!bVar12) {
        local_488._M_allocated_capacity = (size_type)pqVar8;
      }
      tcu::FloatFormat::roundOut((Interval *)&local_568,fmt,(Interval *)local_498,false);
      tcu::FloatFormat::convert((Interval *)local_530,fmt,(Interval *)&local_568);
      pIVar22 = Environment::lookup<float>
                          ((Environment *)&local_2b0,
                           (pVVar10->in1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>
                           .m_ptr);
      pIVar22->m_hi = (double)auStack_520._0_8_;
      *(undefined8 *)pIVar22 = local_530._0_8_;
      pIVar22->m_lo = (double)local_530._8_8_;
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2b0,
                 (pVVar10->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2b0,
                 (pVVar10->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_470.basic.type = (local_570->m_ctx).precision;
      local_478 = (pPVar9->m_ctx).floatFormat.m_maxValue;
      local_498 = *(undefined1 (*) [8])fmt;
      pqStack_490 = *(qpTestLog **)&(pPVar9->m_ctx).floatFormat.m_fractionBits;
      local_488._M_allocated_capacity = *(undefined8 *)&(pPVar9->m_ctx).floatFormat.m_hasInf;
      local_488._8_8_ = *(undefined8 *)&(pPVar9->m_ctx).floatFormat.m_exactPrecision;
      local_460 = 0;
      local_470._8_8_ = &local_2b0;
      (*local_540->_vptr_Statement[3])(local_540,(MessageBuilder *)local_498);
      pIVar21 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_2b0,
                           (pVVar10->out1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_498,&local_318,pIVar21);
      pMVar25 = (MessageBuilder *)local_498;
      pIVar21 = (IVal *)local_208;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *(TestLog **)pIVar21->m_data = pMVar25->m_log;
        pMVar25 = (MessageBuilder *)((long)pMVar25 + (ulong)bVar27 * -0x10 + 8);
        pIVar21 = (IVal *)((long)pIVar21 + ((ulong)bVar27 * -2 + 1) * 8);
      }
      bVar12 = ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doContains
                         ((IVal *)local_208,
                          local_2e0.out1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar26);
      local_498 = (undefined1  [8])&local_488;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_498,"Shader output 1 is outside acceptable range","");
      bVar12 = tcu::ResultCollector::check(local_4a0,bVar12,(string *)local_498);
      if (local_498 != (undefined1  [8])&local_488) {
        operator_delete((void *)local_498,(ulong)(local_488._M_allocated_capacity + 1));
      }
      pIVar21 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_2b0,
                           (local_538->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_498,&local_318,pIVar21);
      pMVar25 = (MessageBuilder *)local_498;
      pIVar21 = (IVal *)local_1a8;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *(TestLog **)pIVar21->m_data = pMVar25->m_log;
        pMVar25 = (MessageBuilder *)((long)pMVar25 + (ulong)bVar27 * -0x10 + 8);
        pIVar21 = (IVal *)((long)pIVar21 + ((ulong)bVar27 * -2 + 1) * 8);
      }
      bVar13 = ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doContains
                         ((IVal *)local_1a8,
                          local_2e0.out0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar26);
      local_498 = (undefined1  [8])&local_488;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_498,"Shader output 0 is outside acceptable range","");
      bVar13 = tcu::ResultCollector::check(local_4a0,bVar13,(string *)local_498);
      if (local_498 != (undefined1  [8])&local_488) {
        operator_delete((void *)local_498,(ulong)(local_488._M_allocated_capacity + 1));
      }
      pVVar10 = local_538;
      if (!bVar12 || !bVar13) {
        uVar15 = (int)local_4a8 + 1;
        local_4a8 = (ulong)uVar15;
        if ((int)uVar15 < 0x65) {
          local_498 = (undefined1  [8])((local_570->super_TestCase).super_TestNode.m_testCtx)->m_log
          ;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pqStack_490);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_490,"Failed",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_490," sample:\n",9)
          ;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_490,"\t",1);
          pVVar5 = (pVVar10->in0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                   .m_ptr;
          val = (Vector<float,_4> *)auStack_520;
          pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
          local_530._0_8_ = val;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_530,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pqStack_490,(char *)local_530._0_8_,local_530._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_490," = ",3);
          valueToString<tcu::Vector<float,4>>
                    (&local_568,(BuiltinPrecisionTests *)&local_318,
                     (FloatFormat *)
                     ((local_548->in0).
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar26),val);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pqStack_490,local_568._M_dataplus._M_p,local_568._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_490,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_568._M_dataplus._M_p != &local_568.field_2) {
            operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
          }
          if ((Vector<float,_4> *)local_530._0_8_ != (Vector<float,_4> *)auStack_520) {
            operator_delete((void *)local_530._0_8_,auStack_520._0_8_ + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_490,"\t",1);
          pVVar7 = (pVVar10->in1).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr;
          local_530._0_8_ = auStack_520;
          pcVar6 = (pVVar7->m_name)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_530,pcVar6,pcVar6 + (pVVar7->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pqStack_490,(char *)local_530._0_8_,local_530._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_490," = ",3);
          valueToString<float>
                    (&local_568,&local_318,
                     (local_548->in1).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar26);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pqStack_490,local_568._M_dataplus._M_p,local_568._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_490,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_568._M_dataplus._M_p != &local_568.field_2) {
            operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_530._0_8_ != auStack_520) {
            operator_delete((void *)local_530._0_8_,auStack_520._0_8_ + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_490,"\t",1);
          pVVar5 = (pVVar10->out0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                   .m_ptr;
          pIVar21 = (IVal *)auStack_520;
          pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
          local_530._0_8_ = pIVar21;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_530,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pqStack_490,(char *)local_530._0_8_,local_530._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_490," = ",3);
          valueToString<tcu::Vector<float,4>>
                    (&local_568,(BuiltinPrecisionTests *)&local_318,
                     (FloatFormat *)
                     (local_2e0.out0.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar26),
                     (Vector<float,_4> *)pIVar21);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pqStack_490,local_568._M_dataplus._M_p,local_568._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_490,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pqStack_490,"\tExpected range: ",0x11);
          intervalToString<tcu::Vector<float,4>>
                    ((string *)(auStack_520 + 0x50),(BuiltinPrecisionTests *)&local_318,
                     (FloatFormat *)local_1a8,pIVar21);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pqStack_490,local_4d0._M_dataplus._M_p,local_4d0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_490,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
            operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_568._M_dataplus._M_p != &local_568.field_2) {
            operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
          }
          if ((IVal *)local_530._0_8_ != (IVal *)auStack_520) {
            operator_delete((void *)local_530._0_8_,auStack_520._0_8_ + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_490,"\t",1);
          pVVar5 = (pVVar10->out1).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                   .m_ptr;
          pIVar21 = (IVal *)auStack_520;
          pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
          local_530._0_8_ = pIVar21;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_530,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pqStack_490,(char *)local_530._0_8_,local_530._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_490," = ",3);
          valueToString<tcu::Vector<float,4>>
                    (&local_568,(BuiltinPrecisionTests *)&local_318,
                     (FloatFormat *)
                     (local_2e0.out1.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar26),
                     (Vector<float,_4> *)pIVar21);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pqStack_490,local_568._M_dataplus._M_p,local_568._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_490,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pqStack_490,"\tExpected range: ",0x11);
          intervalToString<tcu::Vector<float,4>>
                    ((string *)(auStack_520 + 0x50),(BuiltinPrecisionTests *)&local_318,
                     (FloatFormat *)local_208,pIVar21);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pqStack_490,local_4d0._M_dataplus._M_p,local_4d0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_490,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
            operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_568._M_dataplus._M_p != &local_568.field_2) {
            operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
          }
          if ((IVal *)local_530._0_8_ != (IVal *)auStack_520) {
            operator_delete((void *)local_530._0_8_,auStack_520._0_8_ + 1);
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pqStack_490);
          std::ios_base::~ios_base(local_420);
        }
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 != local_2e8);
    iVar14 = (int)local_4a8;
    if (iVar14 < 0x65) {
      if (iVar14 == 0) goto LAB_00706a86;
    }
    else {
      local_498 = (undefined1  [8])((local_570->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pqStack_490);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_490,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)&pqStack_490,iVar14 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_490," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pqStack_490);
      std::ios_base::~ios_base(local_420);
    }
    local_498 = (undefined1  [8])((local_570->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pqStack_490);
    std::ostream::operator<<((ostringstream *)&pqStack_490,iVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pqStack_490,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&pqStack_490);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pqStack_490," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pqStack_490);
  std::ios_base::~ios_base(local_420);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_p != &local_218) {
    operator_delete(local_228._M_p,
                    CONCAT71(local_218._M_allocated_capacity._1_7_,local_218._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_p != &local_238) {
    operator_delete(local_248._M_p,
                    CONCAT71(local_238._M_allocated_capacity._1_7_,local_238._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_280 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_280 + 8));
  if (local_2e0.out1.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e0.out1.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e0.out1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e0.out1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2e0.out0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e0.out0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e0.out0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e0.out0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}